

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_ComputeSimDiff(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vPat2)

{
  Vec_Wrd_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  word wVar5;
  word wVar6;
  long lVar7;
  
  for (lVar7 = 0; lVar7 < p->vCis->nSize; lVar7 = lVar7 + 1) {
    iVar1 = Vec_IntEntry(p->vCis,(int)lVar7);
    pGVar4 = Gia_ManObj(p,iVar1);
    iVar1 = Gia_ObjId(p,pGVar4);
    if (iVar1 == 0) break;
    iVar2 = Vec_IntEntry(vPat,(int)lVar7);
    Vec_WrdWriteEntry(p->vSims,iVar1,2L << ((byte)lVar7 & 0x3f) ^ -(ulong)(iVar2 != 0));
  }
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(undefined8 *)pGVar4;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      wVar5 = Vec_WrdEntry(p->vSims,iVar1 - (uVar3 & 0x1fffffff));
      wVar6 = Vec_WrdEntry(p->vSims,iVar1 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
      Vec_WrdWriteEntry(p->vSims,iVar1,
                        ((*(long *)pGVar4 << 2) >> 0x3f ^ wVar6) &
                        ((long)((int)*(long *)pGVar4 * 4 >> 0x1f) ^ wVar5));
    }
  }
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCo(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar4);
    wVar5 = Vec_WrdEntry(p->vSims,iVar2 - (*(uint *)pGVar4 & 0x1fffffff));
    Vec_WrdWriteEntry(p->vSims,iVar2,(long)((*(int *)pGVar4 << 2) >> 0x1f) ^ wVar5);
  }
  pGVar4 = Gia_ManCo(p,0);
  p_00 = p->vSims;
  iVar1 = Gia_ObjId(p,pGVar4);
  wVar5 = Vec_WrdEntry(p_00,iVar1);
  vPat2->nSize = 0;
  for (lVar7 = 1; lVar7 <= p->vCis->nSize; lVar7 = lVar7 + 1) {
    Vec_IntPush(vPat2,((uint)wVar5 ^ (uint)(wVar5 >> ((byte)lVar7 & 0x3f))) & 1);
  }
  return (uint)wVar5 & 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [For a given random pattern, compute output change.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_ComputeSimDiff( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vPat2 )
{
    Gia_Obj_t * pObj;
    int i, Id; word Sim, Sim0, Sim1;
    Gia_ManForEachCiId( p, Id, i )
    {
        Sim = Vec_IntEntry(vPat, i) ? ~(word)0 : 0;
        Sim ^= (word)1 << (i + 1);
        Vec_WrdWriteEntry( p->vSims, Id, Sim );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, i) );
        Sim1 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId1(pObj, i) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Sim1 = Gia_ObjFaninC1(pObj) ? ~Sim1 : Sim1;
        Vec_WrdWriteEntry( p->vSims, i, Sim0 & Sim1 );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Id = Gia_ObjId( p, pObj );
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, Id) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Vec_WrdWriteEntry( p->vSims, Id, Sim0 );
    }
    pObj = Gia_ManCo( p, 0 );
    Sim = Vec_WrdEntry( p->vSims, Gia_ObjId(p, pObj) );
    Vec_IntClear( vPat2 );
    for ( i = 1; i <= Gia_ManCiNum(p); i++ )
        Vec_IntPush( vPat2, (int)((Sim & 1) ^ ((Sim >> i) & 1)) );
    return (int)(Sim & 1);
}